

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2predicates.cc
# Opt level: O2

int s2pred::ExactCompareLineDistance(Vector3_xf *x,Vector3_xf *a0,Vector3_xf *a1,ExactFloat *r2)

{
  bool bVar1;
  int iVar2;
  ExactFloat local_e0;
  ExactFloat local_d0;
  ExactFloat local_c0;
  ExactFloat cmp;
  BasicVector<Vector3,_ExactFloat,_3UL> local_a0 [8];
  BigNum local_98;
  BasicVector<Vector3,_ExactFloat,_3UL> local_90 [8];
  BigNum local_88;
  ExactFloat sin2_r;
  ExactFloat sin_d;
  Vector3_xf n;
  
  ExactFloat::ExactFloat(n.c_,2.0);
  bVar1 = operator<=(n.c_,r2);
  ExactFloat::BigNum::~BigNum(&n.c_[0].bn_);
  if (bVar1) {
    iVar2 = -1;
  }
  else {
    Vector3<ExactFloat>::CrossProd(&n,a0,a1);
    util::math::internal_vector::BasicVector<Vector3,_ExactFloat,_3UL>::DotProd
              ((BasicVector<Vector3,_ExactFloat,_3UL> *)&sin_d,x);
    ExactFloat::ExactFloat(&local_c0,1);
    ExactFloat::ExactFloat(&local_e0,0.25);
    operator*(&local_d0,&local_e0);
    operator-(&cmp,&local_c0);
    operator*(&sin2_r,r2);
    ExactFloat::BigNum::~BigNum(&cmp.bn_);
    ExactFloat::BigNum::~BigNum(&local_d0.bn_);
    ExactFloat::BigNum::~BigNum(&local_e0.bn_);
    ExactFloat::BigNum::~BigNum(&local_c0.bn_);
    operator*(&local_c0,&sin_d);
    util::math::internal_vector::BasicVector<Vector3,_ExactFloat,_3UL>::Norm2(local_90);
    operator*(&local_e0,&sin2_r);
    util::math::internal_vector::BasicVector<Vector3,_ExactFloat,_3UL>::Norm2(local_a0);
    operator*(&local_d0,&local_e0);
    operator-(&cmp,&local_c0);
    ExactFloat::BigNum::~BigNum(&local_d0.bn_);
    ExactFloat::BigNum::~BigNum(&local_98);
    ExactFloat::BigNum::~BigNum(&local_e0.bn_);
    ExactFloat::BigNum::~BigNum(&local_88);
    ExactFloat::BigNum::~BigNum(&local_c0.bn_);
    iVar2 = 0;
    if ((cmp.bn_exp_ & 0xfffffffdU) != 0x7ffffffd) {
      iVar2 = cmp.sign_;
    }
    ExactFloat::BigNum::~BigNum(&cmp.bn_);
    ExactFloat::BigNum::~BigNum(&sin2_r.bn_);
    ExactFloat::BigNum::~BigNum(&sin_d.bn_);
    Vector3<ExactFloat>::~Vector3(&n);
  }
  return iVar2;
}

Assistant:

int ExactCompareLineDistance(const Vector3_xf& x, const Vector3_xf& a0,
                             const Vector3_xf& a1, const ExactFloat& r2) {
  // Since we are given that the closest point is in the edge interior, the
  // true distance is always less than 90 degrees (which corresponds to a
  // squared chord length of 2.0).
  if (r2 >= 2.0) return -1;  // distance < limit

  // Otherwise compute the edge normal
  Vector3_xf n = a0.CrossProd(a1);
  ExactFloat sin_d = x.DotProd(n);
  ExactFloat sin2_r = r2 * (1 - 0.25 * r2);
  ExactFloat cmp = sin_d * sin_d - sin2_r * x.Norm2() * n.Norm2();
  return cmp.sgn();
}